

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_shape.cxx
# Opt level: O0

void __thiscall Fl_Window::shape_alpha_(Fl_Window *this,Fl_Image *img,int offset)

{
  int iVar1;
  int W;
  int H;
  int iVar2;
  uchar *bits_00;
  char **ppcVar3;
  Fl_Bitmap *this_00;
  Fl_Bitmap *bitmap;
  uchar *p;
  uchar *alpha;
  uchar *bits;
  uint local_38;
  uchar onebit;
  uchar byte;
  uint u;
  int bytesperrow;
  int h;
  int w;
  int d;
  int j;
  int i;
  int offset_local;
  Fl_Image *img_local;
  Fl_Window *this_local;
  
  iVar1 = Fl_Image::d(img);
  W = Fl_Image::w(img);
  H = Fl_Image::h(img);
  iVar2 = (W + 7) / 8;
  bits_00 = (uchar *)operator_new__((long)(H * iVar2));
  ppcVar3 = Fl_Image::data(img);
  p = (uchar *)(*ppcVar3 + offset);
  for (d = 0; d < H; d = d + 1) {
    bitmap = (Fl_Bitmap *)(bits_00 + d * iVar2);
    bits._7_1_ = 0;
    bits._6_1_ = 1;
    for (w = 0; w < W; w = w + 1) {
      if (iVar1 == 3) {
        local_38 = (uint)p[2] + (uint)p[1] + (uint)*p;
      }
      else {
        local_38 = (uint)*p;
      }
      if (local_38 != 0) {
        bits._7_1_ = bits._7_1_ | bits._6_1_;
      }
      bits._6_1_ = bits._6_1_ << 1;
      if ((bits._6_1_ == 0) || (w == W + -1)) {
        bits._6_1_ = 1;
        *(byte *)&(bitmap->super_Fl_Image)._vptr_Fl_Image = bits._7_1_;
        bits._7_1_ = 0;
        bitmap = (Fl_Bitmap *)((long)&(bitmap->super_Fl_Image)._vptr_Fl_Image + 1);
      }
      p = p + iVar1;
    }
  }
  this_00 = (Fl_Bitmap *)operator_new(0x38);
  Fl_Bitmap::Fl_Bitmap(this_00,bits_00,W,H);
  this_00->alloc_array = 1;
  shape_bitmap_(this,(Fl_Image *)this_00);
  shape_data_->todelete_ = this_00;
  return;
}

Assistant:

void Fl_Window::shape_alpha_(Fl_Image* img, int offset) {
  int i, j, d = img->d(), w = img->w(), h = img->h(), bytesperrow = (w+7)/8;
  unsigned u;
  uchar byte, onebit;
  // build an Fl_Bitmap covering the non-fully transparent/black part of the image
  const uchar* bits = new uchar[h*bytesperrow]; // to store the bitmap
  const uchar* alpha = (const uchar*)*img->data() + offset; // points to alpha value of rgba pixels
  for (i = 0; i < h; i++) {
    uchar *p = (uchar*)bits + i * bytesperrow;
    byte = 0;
    onebit = 1;
    for (j = 0; j < w; j++) {
      if (d == 3) {
        u = *alpha;
        u += *(alpha+1);
        u += *(alpha+2);
      }
      else u = *alpha;
      if (u > 0) { // if the pixel is not fully transparent/black
        byte |= onebit; // turn on the corresponding bit of the bitmap
      }
      onebit = onebit << 1; // move the single set bit one position to the left
      if (onebit == 0 || j == w-1) {
        onebit = 1;
        *p++ = byte; // store in bitmap one pack of bits
        byte = 0;
      }
      alpha += d; // point to alpha value of next pixel
    }
  }
  Fl_Bitmap* bitmap = new Fl_Bitmap(bits, w, h);
  bitmap->alloc_array = 1;
  shape_bitmap_(bitmap);
  shape_data_->todelete_ = bitmap;
}